

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

void lua_pushboolean(lua_State *L,int b)

{
  *(char *)((L->top).offset + 8) = (b != 0) * '\x10' + '\x01';
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return;
}

Assistant:

LUA_API void lua_pushboolean (lua_State *L, int b) {
  lua_lock(L);
  if (b)
    setbtvalue(s2v(L->top.p));
  else
    setbfvalue(s2v(L->top.p));
  api_incr_top(L);
  lua_unlock(L);
}